

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinDeserializer<std::tuple<int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>,void>
     ::deserialize_elems<InputStream,0ul,1ul,2ul,3ul>(void)

{
  InputStream *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar1;
  
  uVar1 = 1;
  std::
  get<0ul,int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>
            ((tuple<int,_std::vector<int,_std::allocator<int>_>,_std::pair<short,_short>,_std::deque<char,_std::allocator<char>_>_>
              *)0x165d00);
  deserialize<int,InputStream>
            ((int *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  std::
  get<1ul,int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>
            ((tuple<int,_std::vector<int,_std::allocator<int>_>,_std::pair<short,_short>,_std::deque<char,_std::allocator<char>_>_>
              *)0x165d1f);
  deserialize<std::vector<int,std::allocator<int>>,InputStream>
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  std::
  get<2ul,int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>
            ((tuple<int,_std::vector<int,_std::allocator<int>_>,_std::pair<short,_short>,_std::deque<char,_std::allocator<char>_>_>
              *)0x165d3e);
  deserialize<std::pair<short,short>,InputStream>
            ((pair<short,_short> *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  std::
  get<3ul,int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>
            ((tuple<int,_std::vector<int,_std::allocator<int>_>,_std::pair<short,_short>,_std::deque<char,_std::allocator<char>_>_>
              *)0x165d5d);
  deserialize<std::deque<char,std::allocator<char>>,InputStream>
            ((deque<char,_std::allocator<char>_> *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void deserialize_elems(Tuple<E...>& t, InputStream& istream, std::index_sequence<I...>)
  {
    using swallow = int[];
    using std::get;
    (void)swallow{1, (mserialize::deserialize(get<I>(t), istream), int{})...};
  }